

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::CheckLabelFilterExclude(cmCTestTestHandler *this,cmCTestTestProperties *it)

{
  bool bVar1;
  cmCTestTestProperties *it_local;
  cmCTestTestHandler *this_local;
  
  bVar1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::empty
                    (&this->ExcludeLabelRegularExpressions);
  if (((!bVar1) &&
      (bVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty(&it->Labels), !bVar1)) &&
     (bVar1 = MatchLabelsAgainstFilterRE(&it->Labels,&this->ExcludeLabelRegularExpressions), bVar1))
  {
    it->IsInBasedOnREOptions = false;
  }
  return;
}

Assistant:

void cmCTestTestHandler::CheckLabelFilterExclude(cmCTestTestProperties& it)
{
  // if not using Labels to filter then return
  if (this->ExcludeLabelRegularExpressions.empty()) {
    return;
  }
  // if there are no labels and we are excluding by labels
  // then do nothing as a no label can not be a match
  if (it.Labels.empty()) {
    return;
  }
  // if match was found, exclude the test
  if (MatchLabelsAgainstFilterRE(it.Labels,
                                 this->ExcludeLabelRegularExpressions)) {
    it.IsInBasedOnREOptions = false;
  }
}